

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
InterpreterTest_GlobalInitI32_Test::TestBody(InterpreterTest_GlobalInitI32_Test *this)

{
  Const *left;
  Const *right;
  Binary *pBVar1;
  char *pcVar2;
  initializer_list<wasm::Literal> __l;
  Name name;
  Name NVar3;
  Name NVar4;
  undefined1 local_1e0 [8];
  IRBuilder irBuilder;
  Type local_138;
  Name local_130;
  __shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> local_120;
  undefined1 local_110 [8];
  shared_ptr<wasm::Module> wasm;
  Result<wasm::Expression_*> expr;
  char local_e0;
  undefined1 local_d8 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  AssertionResult gtest_ar;
  undefined1 local_a8 [8];
  Result<wasm::Ok> result;
  Builder local_80;
  Builder builder;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 auStack_68 [8];
  Interpreter interpreter;
  undefined1 local_30 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  
  std::make_shared<wasm::Module>();
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&irBuilder.labelDepths._M_h._M_rehash_policy._M_next_resize;
  local_1e0 = local_110;
  irBuilder.wasm = (Module *)0x0;
  local_80.wasm = (Module *)local_110;
  irBuilder.func = (Function *)local_110;
  irBuilder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._M_u._12_1_ = 0;
  irBuilder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._16_8_ = 0;
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  irBuilder.builder.wasm = (Module *)0x0;
  irBuilder.binaryPos = (size_t *)0x0;
  irBuilder.lastBinaryPos = 0;
  irBuilder.labelDepths._M_h._M_buckets = (__buckets_ptr)0x1;
  irBuilder.labelDepths._M_h._M_bucket_count = 0;
  irBuilder.labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  irBuilder.labelDepths._M_h._M_element_count._0_4_ = 0x3f800000;
  irBuilder.labelDepths._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  irBuilder.labelDepths._M_h._M_rehash_policy._4_4_ = 0;
  irBuilder.labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  irBuilder.labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::wasm::Name::Name((Name *)&irBuilder.blockHint,"global");
  left = ::wasm::Builder::makeConst<int>(&local_80,2);
  right = ::wasm::Builder::makeConst<int>(&local_80,3);
  pBVar1 = ::wasm::Builder::makeBinary(&local_80,AddInt32,(Expression *)left,(Expression *)right);
  name.super_IString.str._M_str = (char *)irBuilder._152_8_;
  name.super_IString.str._M_len = (size_t)auStack_68;
  ::wasm::Builder::makeGlobal(name,local_138,(Expression *)0x2,(Mutability)pBVar1);
  ::wasm::Module::addGlobal((unique_ptr *)local_110);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_68);
  pcVar2 = (char *)0x2;
  NVar3.super_IString.str._M_str = local_1e0;
  NVar3.super_IString.str._M_len = (size_t)auStack_68;
  ::wasm::IRBuilder::makeBlock(NVar3,(Signature)ZEXT816(0));
  wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       (char)interpreter.store.instances.
             super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
             ._M_impl.super__Vector_impl_data._M_start != '\x01';
  _expr = 0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_68);
  if ((char)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      '\0') {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_68,
               (internal *)
               &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (AssertionResult *)
               "irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr()","true",
               "false",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x3be,(char *)auStack_68);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)local_a8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expr);
    ::wasm::Name::Name(&local_130,"global");
    NVar4.super_IString.str._M_str = local_1e0;
    NVar4.super_IString.str._M_len = (size_t)auStack_68;
    ::wasm::IRBuilder::makeGlobalGet(NVar4);
    wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         (char)interpreter.store.instances.
               super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
               ._M_impl.super__Vector_impl_data._M_start != '\x01';
    _expr = 0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_68);
    if ((char)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        '\0') {
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_68,
                 (internal *)
                 &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (AssertionResult *)"irBuilder.makeGlobalGet(\"global\").getErr()","true","false",
                 pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x3bf,(char *)auStack_68);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)local_a8);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&expr);
      ::wasm::IRBuilder::visitEnd();
      wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
           (char)interpreter.store.instances.
                 super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_start != '\x01';
      _expr = 0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_68);
      if ((char)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != '\0') {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&expr);
        ::wasm::IRBuilder::build();
        _result = 0;
        local_a8[0] = local_e0 != '\x01';
        if (local_e0 == '\x01') {
          testing::Message::Message((Message *)local_30);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_68,(internal *)local_a8,(AssertionResult *)"expr.getErr()",
                     "true","false",pcVar2);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x3c3,(char *)auStack_68);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_30);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
          std::__cxx11::string::~string((string *)auStack_68);
          if (local_30 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_30 + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result);
          interpreter.store.instances.
          super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          interpreter.store.instances.
          super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_68 = (undefined1  [8])0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_120,(__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)local_110)
          ;
          ::wasm::Interpreter::addInstance(local_a8,auStack_68,&local_120);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
          ::wasm::Interpreter::runTest((Expression *)local_30);
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x2;
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_d8,__l,
                     (allocator_type *)&local_70);
          ::wasm::Literal::~Literal
                    ((Literal *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::
          CmpHelperEQ<std::vector<wasm::Literal,std::allocator<wasm::Literal>>,std::vector<wasm::Literal,std::allocator<wasm::Literal>>>
                    ((internal *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_30,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_d8);
          if ((char)expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
            testing::Message::Message((Message *)&local_70);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&builder,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,0x3ca,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&builder,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
            if (local_70._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_70._M_head_impl + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_d8);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_30);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
          ::wasm::interpreter::WasmStore::~WasmStore((WasmStore *)auStack_68);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                          &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        goto LAB_0019d36f;
      }
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_68,
                 (internal *)
                 &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (AssertionResult *)"irBuilder.visitEnd().getErr()","true","false",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x3c0,(char *)auStack_68);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)local_a8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
  std::__cxx11::string::~string((string *)auStack_68);
  if ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&expr);
LAB_0019d36f:
  ::wasm::IRBuilder::~IRBuilder((IRBuilder *)local_1e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm);
  return;
}

Assistant:

TEST(InterpreterTest, GlobalInitI32) {
  auto wasm = std::make_shared<Module>();
  Builder builder(*wasm);
  IRBuilder irBuilder(*wasm);
  wasm->addGlobal(builder.makeGlobal(
    "global",
    Type::i32,
    builder.makeBinary(
      AddInt32, builder.makeConst(int32_t(2)), builder.makeConst(int32_t(3))),
    Builder::Mutable));

  ASSERT_FALSE(
    irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr());
  ASSERT_FALSE(irBuilder.makeGlobalGet("global").getErr());
  ASSERT_FALSE(irBuilder.visitEnd().getErr());

  auto expr = irBuilder.build();
  ASSERT_FALSE(expr.getErr());

  Interpreter interpreter;
  auto result = interpreter.addInstance(wasm);
  auto results = interpreter.runTest(*expr);
  std::vector<Literal> expected{Literal(int32_t(5))};

  EXPECT_EQ(results, expected);
}